

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

static_huffman_data_model * __thiscall
crnlib::static_huffman_data_model::operator=
          (static_huffman_data_model *this,static_huffman_data_model *rhs)

{
  decoder_tables *pdVar1;
  decoder_tables *in_RSI;
  decoder_tables *in_RDI;
  decoder_tables *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    in_RDI->m_num_syms = in_RSI->m_num_syms;
    vector<unsigned_short>::operator=
              ((vector<unsigned_short> *)in_RSI,(vector<unsigned_short> *)in_RDI);
    vector<unsigned_char>::operator=
              ((vector<unsigned_char> *)in_RSI,(vector<unsigned_char> *)in_RDI);
    if (*(long *)(in_RSI->m_max_codes + 3) == 0) {
      crnlib_delete<crnlib::prefix_coding::decoder_tables>((decoder_tables *)0x230c60);
      in_RDI->m_max_codes[3] = 0;
      in_RDI->m_max_codes[4] = 0;
    }
    else if (*(long *)(in_RDI->m_max_codes + 3) == 0) {
      pdVar1 = crnlib_new<crnlib::prefix_coding::decoder_tables,crnlib::prefix_coding::decoder_tables>
                         (in_RDI);
      *(decoder_tables **)(in_RDI->m_max_codes + 3) = pdVar1;
    }
    else {
      prefix_coding::decoder_tables::operator=(in_RSI,in_RDI);
    }
    *(byte *)(in_RDI->m_max_codes + 5) = (byte)in_RSI->m_max_codes[5] & 1;
    local_8 = in_RDI;
  }
  return (static_huffman_data_model *)local_8;
}

Assistant:

static_huffman_data_model& static_huffman_data_model::operator=(const static_huffman_data_model& rhs) {
  if (this == &rhs)
    return *this;

  m_total_syms = rhs.m_total_syms;
  m_codes = rhs.m_codes;
  m_code_sizes = rhs.m_code_sizes;

  if (rhs.m_pDecode_tables) {
    if (m_pDecode_tables)
      *m_pDecode_tables = *rhs.m_pDecode_tables;
    else
      m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
  } else {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }

  m_encoding = rhs.m_encoding;

  return *this;
}